

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x6e696f50;
  *(undefined2 *)((long)&in_RDI->field_2 + 4) = 0x74;
  in_RDI->_M_string_length = 5;
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }